

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzePhiInstruction
          (ScalarEvolutionAnalysis *this,Instruction *phi)

{
  mapped_type pSVar1;
  key_type pLVar2;
  pointer ppSVar3;
  ScalarEvolutionAnalysis *pSVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  DefUseManager *this_00;
  BasicBlock *this_01;
  LoopDescriptor *this_02;
  mapped_type *ppSVar10;
  mapped_type *ppLVar11;
  key_type *__k;
  ScalarEvolutionAnalysis *pSVar12;
  Instruction *inst;
  SENode *pSVar13;
  long lVar14;
  ScalarEvolutionAnalysis *this_03;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> _Var15;
  ScalarEvolutionAnalysis *node;
  Instruction *phi_local;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_50;
  Loop *loop;
  map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
  *local_40;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_38;
  
  phi_local = phi;
  uVar6 = Instruction::NumInOperands(phi);
  if (uVar6 == 4) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    this_01 = IRContext::get_instr_block(this->context_,phi);
    this_02 = IRContext::GetLoopDescriptor(this->context_,this_01->function_);
    if (this_02 != (LoopDescriptor *)0x0) {
      uVar6 = BasicBlock::id(this_01);
      loop = LoopDescriptor::FindLoopForBasicBlock(this_02,uVar6);
      if ((((loop == (Loop *)0x0) || (loop->loop_latch_ == (BasicBlock *)0x0)) ||
          (loop->loop_preheader_ == (BasicBlock *)0x0)) || (loop->loop_header_ != this_01)) {
        pSVar1 = this->cached_cant_compute_;
        ppSVar10 = std::
                   map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                   ::operator[](&this->recurrent_node_map_,&phi_local);
        *ppSVar10 = pSVar1;
        return pSVar1;
      }
      __k = &loop;
      ppLVar11 = std::
                 map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
                 ::operator[](&this->pretend_equal_,__k);
      if (*ppLVar11 != (mapped_type)0x0) {
        __k = std::
              map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
              ::operator[](&this->pretend_equal_,&loop);
      }
      pLVar2 = *__k;
      pSVar12 = (ScalarEvolutionAnalysis *)::operator_new(0x48);
      *(undefined8 *)&(pSVar12->recurrent_node_map_)._M_t._M_impl = 0;
      *(pointer *)&(pSVar12->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header =
           (pointer)0x0;
      (pSVar12->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (pSVar12->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)this;
      SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
      *(int *)&(pSVar12->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           = SENode::NumberOfNodes;
      pSVar12->context_ = (IRContext *)&PTR_GetType_00a71098;
      (pSVar12->node_cache_)._M_h._M_buckets = (__buckets_ptr)pLVar2;
      local_40 = &this->recurrent_node_map_;
      ppSVar10 = std::
                 map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                 ::operator[](local_40,&phi_local);
      *ppSVar10 = (mapped_type)pSVar12;
      uVar6 = 0;
      local_50._M_head_impl = (SENode *)pSVar12;
      do {
        uVar7 = Instruction::NumInOperands(phi_local);
        if (uVar7 <= uVar6) {
          local_38._M_t.
          super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>.
          _M_t.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
               (__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
                )(__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
                  )local_50._M_head_impl;
          pSVar13 = GetCachedOrAdd(this,&local_38);
          ppSVar10 = std::
                     map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                     ::operator[](local_40,&phi_local);
          *ppSVar10 = pSVar13;
          _Var15._M_head_impl =
               (SENode *)
               local_38._M_t.
               super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
               .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
          if (local_38._M_t.
              super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
              .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>)
              0x0) {
            return pSVar13;
          }
LAB_004fa927:
          (*(code *)(((IRContext *)(_Var15._M_head_impl)->_vptr_SENode)->grammar_).operandTable_)();
          return pSVar13;
        }
        uVar7 = Instruction::GetSingleWordInOperand(phi_local,uVar6);
        uVar8 = Instruction::GetSingleWordInOperand(phi_local,uVar6 + 1);
        inst = analysis::DefUseManager::GetDef(this_00,uVar7);
        pSVar13 = AnalyzeInstruction(this,inst);
        iVar9 = (**pSVar13->_vptr_SENode)(pSVar13);
        if (iVar9 == 6) goto LAB_004fa8d5;
        uVar7 = BasicBlock::id(loop->loop_preheader_);
        if (uVar8 == uVar7) {
          SERecurrentNode::AddOffset((SERecurrentNode *)local_50._M_head_impl,pSVar13);
        }
        else {
          uVar7 = BasicBlock::id(loop->loop_latch_);
          if (uVar8 == uVar7) {
            iVar9 = (**pSVar13->_vptr_SENode)(pSVar13);
            if (iVar9 == 2) {
              ppSVar3 = (pSVar13->children_).
                        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar12 = (ScalarEvolutionAnalysis *)*ppSVar3;
              pSVar4 = (ScalarEvolutionAnalysis *)ppSVar3[1];
              lVar14 = (*(code *)(pSVar12->context_->module_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl
                       )(pSVar12);
              node = pSVar12;
              if ((lVar14 != 0) &&
                 (lVar14 = (*(code *)(pSVar4->context_->module_)._M_t.
                                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                     _M_head_impl)(pSVar4), node = pSVar4, lVar14 != 0)) {
                node = (ScalarEvolutionAnalysis *)0x0;
              }
              this_03 = pSVar12;
              lVar14 = (*(code *)(pSVar12->context_->module_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl
                       )();
              if ((lVar14 == 0) &&
                 (this_03 = pSVar4,
                 pSVar12 = (ScalarEvolutionAnalysis *)
                           (*(code *)(pSVar4->context_->module_)._M_t.
                                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                     _M_head_impl)(), pSVar12 != (ScalarEvolutionAnalysis *)0x0)) {
                pSVar12 = pSVar4;
              }
              if (((node != (ScalarEvolutionAnalysis *)0x0) &&
                  (pSVar12 == (ScalarEvolutionAnalysis *)local_50._M_head_impl)) &&
                 (bVar5 = IsLoopInvariant(this_03,loop,(SENode *)node), bVar5)) {
                SERecurrentNode::AddCoefficient
                          ((SERecurrentNode *)local_50._M_head_impl,(SENode *)node);
                goto LAB_004fa8cd;
              }
            }
LAB_004fa8d5:
            pSVar13 = this->cached_cant_compute_;
            ppSVar10 = std::
                       map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                       ::operator[](local_40,&phi_local);
            *ppSVar10 = pSVar13;
            _Var15._M_head_impl = local_50._M_head_impl;
            goto LAB_004fa927;
          }
        }
LAB_004fa8cd:
        uVar6 = uVar6 + 2;
      } while( true );
    }
  }
  return this->cached_cant_compute_;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzePhiInstruction(const Instruction* phi) {
  // The phi should only have two incoming value pairs.
  if (phi->NumInOperands() != 4) {
    return CreateCantComputeNode();
  }

  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  // Get the basic block this instruction belongs to.
  BasicBlock* basic_block =
      context_->get_instr_block(const_cast<Instruction*>(phi));

  // And then the function that the basic blocks belongs to.
  Function* function = basic_block->GetParent();

  // Use the function to get the loop descriptor.
  LoopDescriptor* loop_descriptor = context_->GetLoopDescriptor(function);

  // We only handle phis in loops at the moment.
  if (!loop_descriptor) return CreateCantComputeNode();

  // Get the innermost loop which this block belongs to.
  Loop* loop = (*loop_descriptor)[basic_block->id()];

  // If the loop doesn't exist or doesn't have a preheader or latch block, exit
  // out.
  if (!loop || !loop->GetLatchBlock() || !loop->GetPreHeaderBlock() ||
      loop->GetHeaderBlock() != basic_block)
    return recurrent_node_map_[phi] = CreateCantComputeNode();

  const Loop* loop_to_use = nullptr;
  if (pretend_equal_[loop]) {
    loop_to_use = pretend_equal_[loop];
  } else {
    loop_to_use = loop;
  }
  std::unique_ptr<SERecurrentNode> phi_node{
      new SERecurrentNode(this, loop_to_use)};

  // We add the node to this map to allow it to be returned before the node is
  // fully built. This is needed as the subsequent call to AnalyzeInstruction
  // could lead back to this |phi| instruction so we return the pointer
  // immediately in AnalyzeInstruction to break the recursion.
  recurrent_node_map_[phi] = phi_node.get();

  // Traverse the operands of the instruction an create new nodes for each one.
  for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
    uint32_t value_id = phi->GetSingleWordInOperand(i);
    uint32_t incoming_label_id = phi->GetSingleWordInOperand(i + 1);

    Instruction* value_inst = def_use->GetDef(value_id);
    SENode* value_node = AnalyzeInstruction(value_inst);

    // If any operand is CantCompute then the whole graph is CantCompute.
    if (value_node->IsCantCompute())
      return recurrent_node_map_[phi] = CreateCantComputeNode();

    // If the value is coming from the preheader block then the value is the
    // initial value of the phi.
    if (incoming_label_id == loop->GetPreHeaderBlock()->id()) {
      phi_node->AddOffset(value_node);
    } else if (incoming_label_id == loop->GetLatchBlock()->id()) {
      // Assumed to be in the form of step + phi.
      if (value_node->GetType() != SENode::Add)
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      SENode* step_node = nullptr;
      SENode* phi_operand = nullptr;
      SENode* operand_1 = value_node->GetChild(0);
      SENode* operand_2 = value_node->GetChild(1);

      // Find which node is the step term.
      if (!operand_1->AsSERecurrentNode())
        step_node = operand_1;
      else if (!operand_2->AsSERecurrentNode())
        step_node = operand_2;

      // Find which node is the recurrent expression.
      if (operand_1->AsSERecurrentNode())
        phi_operand = operand_1;
      else if (operand_2->AsSERecurrentNode())
        phi_operand = operand_2;

      // If it is not in the form step + phi exit out.
      if (!(step_node && phi_operand))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      // If the phi operand is not the same phi node exit out.
      if (phi_operand != phi_node.get())
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      if (!IsLoopInvariant(loop, step_node))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      phi_node->AddCoefficient(step_node);
    }
  }

  // Once the node is fully built we update the map with the version from the
  // cache (if it has already been added to the cache).
  return recurrent_node_map_[phi] = GetCachedOrAdd(std::move(phi_node));
}